

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall
sf::priv::GlxContext::GlxContext
          (GlxContext *this,GlxContext *shared,ContextSettings *settings,WindowImpl *owner,
          uint param_5)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Display *pDVar4;
  GlxContext *this_00;
  long *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  GlxContext *in_stack_000001e8;
  GlxContext *in_stack_000001f0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Display *in_stack_ffffffffffffffb0;
  GlContext *in_stack_ffffffffffffffd0;
  
  GlContext::GlContext(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__GlxContext_00493ca0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  uVar3 = *(undefined8 *)((long)in_RDX + 0x11);
  *(undefined8 *)((long)in_RDI + 0x11) = *(undefined8 *)((long)in_RDX + 9);
  *(undefined8 *)((long)in_RDI + 0x19) = uVar3;
  in_RDI[1] = uVar1;
  in_RDI[2] = uVar2;
  pDVar4 = OpenDisplay();
  in_RDI[6] = pDVar4;
  anon_unknown.dwarf_27d252::ensureExtensionsInit
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  this_00 = (GlxContext *)(**(code **)(*in_RCX + 0x10))();
  createSurface(this_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  createContext(in_stack_000001f0,in_stack_000001e8);
  return;
}

Assistant:

GlxContext::GlxContext(GlxContext* shared, const ContextSettings& settings, const WindowImpl* owner, unsigned int /*bitsPerPixel*/) :
m_display   (NULL),
m_window    (0),
m_context   (NULL),
m_pbuffer   (0),
m_ownsWindow(false)
{
    // Save the creation settings
    m_settings = settings;

    // Open the connection with the X server
    m_display = OpenDisplay();

    // Make sure that extensions are initialized
    ensureExtensionsInit(m_display, DefaultScreen(m_display));

    // Create the rendering surface from the owner window
    createSurface(owner->getSystemHandle());

    // Create the context
    createContext(shared);
}